

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.cc
# Opt level: O0

string * QPDFExc::createWhat(string *__return_storage_ptr__,string *filename,string *object,
                            qpdf_offset_t offset,string *message)

{
  ulong uVar1;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_31;
  string *local_30;
  string *message_local;
  qpdf_offset_t offset_local;
  string *object_local;
  string *filename_local;
  string *result;
  
  local_31 = 0;
  local_30 = message;
  message_local = (string *)offset;
  offset_local = (qpdf_offset_t)object;
  object_local = filename;
  filename_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)object_local);
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) || (-1 < (long)message_local)) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," (");
    }
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) &&
       (std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)offset_local),
       -1 < (long)message_local)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    if (-1 < (long)message_local) {
      std::__cxx11::to_string(&local_88,(longlong)message_local);
      std::operator+(&local_68,"offset ",&local_88);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
    }
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
    }
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,": ");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFExc::createWhat(
    std::string const& filename,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message)
{
    std::string result;
    if (!filename.empty()) {
        result += filename;
    }
    if (!(object.empty() && offset < 0)) {
        if (!filename.empty()) {
            result += " (";
        }
        if (!object.empty()) {
            result += object;
            if (offset >= 0) {
                result += ", ";
            }
        }
        if (offset >= 0) {
            result += "offset " + std::to_string(offset);
        }
        if (!filename.empty()) {
            result += ")";
        }
    }
    if (!result.empty()) {
        result += ": ";
    }
    result += message;
    return result;
}